

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

StringRef __thiscall Catch::trim(Catch *this,StringRef ref)

{
  Catch *pCVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  StringRef SVar8;
  
  pcVar4 = ref.m_start;
  bVar7 = pcVar4 != (char *)0x0;
  if (pcVar4 == (char *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar2 = (char *)0x0;
    do {
      pcVar3 = pcVar2;
      if ((0x20 < (ulong)(byte)this[(long)pcVar2]) ||
         ((0x100002600U >> ((ulong)(byte)this[(long)pcVar2] & 0x3f) & 1) == 0)) break;
      pcVar2 = pcVar2 + 1;
      bVar7 = pcVar2 < pcVar4;
      pcVar3 = pcVar4;
    } while (pcVar2 != pcVar4);
  }
  uVar6 = (long)pcVar4 - (long)pcVar3;
  pcVar2 = pcVar4;
  if (pcVar3 <= pcVar4 && uVar6 != 0) {
    do {
      pcVar2 = pcVar4;
      if ((0x20 < (ulong)(byte)(this + -1)[(long)pcVar4]) ||
         ((0x100002600U >> ((ulong)(byte)(this + -1)[(long)pcVar4] & 0x3f) & 1) == 0)) break;
      pcVar4 = pcVar4 + -1;
      pcVar2 = pcVar3;
    } while (pcVar3 < pcVar4);
  }
  uVar5 = (long)pcVar2 - (long)pcVar3;
  if (uVar6 < (ulong)((long)pcVar2 - (long)pcVar3)) {
    uVar5 = uVar6;
  }
  uVar6 = 0;
  if (bVar7) {
    uVar6 = uVar5;
  }
  pCVar1 = (Catch *)(anon_var_dwarf_d0e4d5 + 9);
  if (bVar7) {
    pCVar1 = this + (long)pcVar3;
  }
  SVar8.m_size = uVar6;
  SVar8.m_start = (char *)pCVar1;
  return SVar8;
}

Assistant:

StringRef trim(StringRef ref) {
        const auto is_ws = [](char c) {
            return c == ' ' || c == '\t' || c == '\n' || c == '\r';
        };
        size_t real_begin = 0;
        while (real_begin < ref.size() && is_ws(ref[real_begin])) { ++real_begin; }
        size_t real_end = ref.size();
        while (real_end > real_begin && is_ws(ref[real_end - 1])) { --real_end; }

        return ref.substr(real_begin, real_end - real_begin);
    }